

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_SeeJSON.c
# Opt level: O3

void main_cold_13(void)

{
  FILE *__stream;
  uint uVar1;
  json_node *in_RDI;
  
  __stream = _stderr;
  uVar1 = json_parse(in_RDI,"[ [ ] , [ 0 ] , [ 0 , 1 ] , [ 0 , 1 , 2 ] ]");
  fprintf(__stream,"%s:%d\nExpect for: %d \nBut actually get: %d\n\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lrx0014[P]SeeJson/src/Test_SeeJSON.c"
          ,0x15e,0,(ulong)uVar1);
  status = 1;
  return;
}

Assistant:

static void test_for_parse_array()
{
    size_t i,j;
    json_node node;
    json_init(&node);
    TEST_INT(JSON_PARSE_SUCCESS,json_parse(&node,"[ ]"));
    TEST_INT(JSON_ARRAY,json_get_type(&node));
    TEST_SIZE_T(0,json_get_array_size(&node));
    json_free(&node);

    json_init(&node);
    TEST_INT(JSON_PARSE_SUCCESS, json_parse(&node, "[ null , false , true , 123 , \"abc\" ]"));
    TEST_INT(JSON_ARRAY, json_get_type(&node));
    TEST_SIZE_T(5, json_get_array_size(&node));
    TEST_INT(JSON_NULL,   json_get_type(json_get_array_element_by_index(&node, 0)));
    TEST_INT(JSON_FALSE,  json_get_type(json_get_array_element_by_index(&node, 1)));
    TEST_INT(JSON_TRUE,   json_get_type(json_get_array_element_by_index(&node, 2)));
    TEST_INT(JSON_NUMBER, json_get_type(json_get_array_element_by_index(&node, 3)));
    TEST_INT(JSON_STRING, json_get_type(json_get_array_element_by_index(&node, 4)));
    TEST_DOUBLE(123.0, json_get_number(json_get_array_element_by_index(&node, 3)));
    TEST_STRING_IS_RIGHT("abc", json_get_string(json_get_array_element_by_index(&node, 4)), json_get_string_length(json_get_array_element_by_index(&node, 4)));
    json_free(&node);

    json_init(&node);
    TEST_INT(JSON_PARSE_SUCCESS, json_parse(&node, "[ [ ] , [ 0 ] , [ 0 , 1 ] , [ 0 , 1 , 2 ] ]"));
    TEST_INT(JSON_ARRAY, json_get_type(&node));
    TEST_SIZE_T(4, json_get_array_size(&node));
    for (i = 0; i < 4; i++) {
        json_node* a = json_get_array_element_by_index(&node, i);
        TEST_INT(JSON_ARRAY, json_get_type(a));
        TEST_SIZE_T(i, json_get_array_size(a));
        for (j = 0; j < i; j++) {
            json_node* e = json_get_array_element_by_index(a, j);
            TEST_INT(JSON_NUMBER, json_get_type(e));
            TEST_DOUBLE((double)j, json_get_number(e));
        }
    }
    json_free(&node);
}